

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  uint8_t *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint *puVar6;
  upb_MiniTableField *puVar7;
  uint *puVar8;
  char cVar9;
  uint16_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  upb_MtDecoder *puVar16;
  byte bVar17;
  char *pcVar18;
  ulong uVar19;
  upb_MtDecoder *puVar20;
  byte *pbVar21;
  uint uVar22;
  int iVar23;
  uint unaff_R12D;
  ulong uVar24;
  uint *puVar25;
  uint *puVar26;
  bool bVar27;
  bool bVar28;
  upb_LayoutItem item;
  upb_LayoutItem item_00;
  uint *local_70;
  uint *local_60;
  ulong extraout_RDX;
  
  bVar28 = d->table != (upb_MiniTable *)0x0;
  (d->base).end = ptr + len;
  uVar5 = 0;
  local_70 = (uint *)0x0;
  uVar13 = 0;
  do {
    puVar6 = (uint *)(d->base).end;
    if (puVar6 <= ptr) {
      if (!bVar28) {
        return (char *)(uint *)ptr;
      }
      d->table->dense_below_dont_copy_me__upb_internal_use_only =
           (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
      return (char *)(uint *)ptr;
    }
    puVar25 = (uint *)((long)ptr + 1);
    bVar17 = (byte)*(uint *)ptr;
    uVar19 = (ulong)(char)bVar17;
    uVar15 = (ulong)bVar17;
    puVar8 = (uint *)fields;
    uVar14 = uVar13;
    if ((long)uVar19 < 0x4a) {
      if ((d->table != (upb_MiniTable *)0x0) || (local_70 == (uint *)0x0)) {
        *field_count = *field_count + 1;
        uVar5 = uVar5 + 1;
        *(uint *)fields = uVar5;
        bVar4 = 0xff;
        if (0xa0 < (byte)(bVar17 + 0x81)) {
          bVar4 = ""[(int)(char)bVar17 - 0x20];
        }
        cVar9 = (d->platform != kUpb_MiniTablePlatform_32Bit) * '\x02' + '\x01';
        if (bVar17 < 0x36) {
          *(byte *)((long)fields + 0xb) = 2;
          *(undefined2 *)((long)fields + 4) = 1;
          if ((bVar4 & 0xfe) == 0x10) {
LAB_00124225:
            *(byte *)((long)fields + 0xb) = cVar9 << 6 | 2;
            goto LAB_00124421;
          }
          if (bVar4 < 0x13) {
            cVar9 = upb_MiniTable_SetField_kUpb_EncodedToFieldRep[bVar4];
            goto LAB_00124225;
          }
        }
        else {
          bVar4 = bVar4 - 0x14;
          *(byte *)((long)fields + 0xb) = cVar9 * '@' + 1;
          *(undefined2 *)((long)fields + 4) = 0;
LAB_00124421:
          if (bVar4 < 0x13) {
            bVar17 = 5;
            if (bVar4 == 0xc) {
LAB_00124436:
              bVar4 = bVar17;
              *(byte *)((long)fields + 0xb) = *(byte *)((long)fields + 0xb) | 0x10;
            }
            else if (bVar4 == 0xf) {
              bVar4 = 9;
              bVar17 = 0xc;
              if ((uVar13 & 1) == 0) goto LAB_00124436;
            }
            else {
              bVar4 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar4];
            }
            *(byte *)((long)fields + 10) = bVar4;
            if ((((uVar13 & 2) != 0) && ((*(byte *)((long)fields + 0xb) & 1) != 0)) &&
               ((1 << (bVar4 & 0x1f) & 0xffffe1ffU) != 0)) {
              *(byte *)((long)fields + 0xb) = *(byte *)((long)fields + 0xb) | 4;
            }
            if ((bVar4 & 0xfe) == 10) {
              uVar10 = sub_counts->submsg_count;
              sub_counts->submsg_count = uVar10 + 1;
LAB_001245ed:
              *(uint16_t *)((long)fields + 8) = uVar10;
            }
            else {
              if (bVar4 == 0xe) {
                uVar10 = sub_counts->subenum_count;
                sub_counts->subenum_count = uVar10 + 1;
                goto LAB_001245ed;
              }
              *(undefined2 *)((long)fields + 8) = 0xffff;
            }
            bVar27 = true;
            puVar8 = (uint *)(field_size + (long)fields);
            ptr = (char *)puVar25;
            local_70 = (uint *)fields;
            goto LAB_00124605;
          }
        }
        uVar15 = (ulong)(uint)(int)(char)bVar4;
        pcVar18 = "Invalid field type: %d";
LAB_001246ea:
        upb_MdDecoder_ErrorJmp(&d->base,pcVar18,uVar15);
      }
      bVar27 = false;
      local_60 = (uint *)ptr;
    }
    else if ((byte)(bVar17 + 0xb4) < 0x10) {
      uVar14 = 0xe;
      for (uVar12 = 0x1f; 0xeU >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
      uVar22 = 0;
      uVar11 = 0;
      do {
        iVar23 = -1;
        if (0xa0 < (byte)((char)uVar19 + 0x81U)) {
          iVar23 = (int)""[((uint)uVar19 & 0xff) - 0x20];
        }
        uVar22 = uVar22 | iVar23 + -0x2a << ((byte)uVar11 & 0x1f);
        if ((puVar25 == puVar6) || (uVar3 = *puVar25, (byte)((byte)uVar3 + 0xa4) < 0xf0)) {
          bVar27 = false;
          ptr = (char *)puVar25;
          uVar14 = uVar22;
        }
        else {
          puVar25 = (uint *)((long)puVar25 + 1);
          uVar11 = uVar11 + (uVar12 ^ 0xffffffe0) + 0x21;
          bVar27 = uVar11 < 0x20;
          if (!bVar27) {
            ptr = (char *)0x0;
          }
          uVar19 = (ulong)(byte)uVar3;
        }
      } while (bVar27);
      if ((uint *)ptr == (uint *)0x0) {
LAB_00124668:
        pcVar18 = "Overlong varint";
LAB_001246d6:
        upb_MdDecoder_ErrorJmp(&d->base,pcVar18);
      }
      if (local_70 == (uint *)0x0) {
        if (d->table == (upb_MiniTable *)0x0) {
          pcVar18 = "Extensions cannot have message modifiers";
          goto LAB_001246d6;
        }
      }
      else {
        if ((uVar14 & 1) != 0) {
          if (((*(byte *)((long)local_70 + 0xb) & 1) == 0) ||
             ((0xffffe1ffU >> (*(byte *)((long)local_70 + 10) & 0x1f) & 1) == 0)) {
            uVar15 = (ulong)*local_70;
            pcVar18 = "Cannot flip packed on unpackable field %u";
            goto LAB_001246ea;
          }
          *(byte *)((long)local_70 + 0xb) = *(byte *)((long)local_70 + 0xb) ^ 4;
        }
        if ((uVar14 & 8) != 0) {
          if ((*(byte *)((long)local_70 + 10) != 0xc) ||
             ((*(byte *)((long)local_70 + 0xb) & 0x10) == 0)) {
            upb_MdDecoder_ErrorJmp
                      (&d->base,"Cannot flip ValidateUtf8 on field %u, type=%d, mode=%d",
                       (ulong)*local_70,(ulong)*(byte *)((long)local_70 + 10),
                       (ulong)*(byte *)((long)local_70 + 0xb));
          }
          *(byte *)((long)local_70 + 10) = 9;
          *(byte *)((long)local_70 + 0xb) = *(byte *)((long)local_70 + 0xb) & 0xef;
        }
        if ((uVar14 & 6) != 0) {
          if ((short)local_70[1] != 1) {
            uVar15 = (ulong)*local_70;
            pcVar18 = "Invalid modifier(s) for repeated field %u";
            goto LAB_001246ea;
          }
          if ((uVar14 & 6) == 6) {
            uVar15 = (ulong)*local_70;
            pcVar18 = "Field %u cannot be both singular and required";
            goto LAB_001246ea;
          }
        }
        if ((uVar14 & 4) != 0) {
          if ((*(byte *)((long)local_70 + 10) & 0xfe) == 10) {
            uVar15 = (ulong)*local_70;
            pcVar18 = "Field %u cannot be a singular submessage";
            goto LAB_001246ea;
          }
          *(undefined2 *)(local_70 + 1) = 0;
        }
        uVar12 = uVar14 & 2;
        uVar14 = uVar13;
        if (uVar12 != 0) {
          *(undefined2 *)(local_70 + 1) = 2;
        }
      }
      bVar27 = true;
      if ((uVar14 & 4) != 0) {
        puVar1 = &d->table->ext_dont_copy_me__upb_internal_use_only;
        *puVar1 = *puVar1 | 1;
      }
    }
    else if (bVar17 == 0x5e) {
      if (d->table == (upb_MiniTable *)0x0) {
        pcVar18 = "Extensions cannot have oneofs.";
        goto LAB_001246d6;
      }
      uVar19 = 0xffff;
      ptr = (char *)puVar25;
      if (puVar25 < puVar6) {
        uVar24 = 0xffff;
        uVar19 = 0;
        do {
          bVar17 = (byte)*puVar25;
          puVar25 = (uint *)((long)puVar25 + 1);
          if (bVar17 != 0x7c) {
            if (bVar17 != 0x7e) {
              for (uVar13 = 0x1f; 0x3eU >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
              puVar20 = (upb_MtDecoder *)0x0;
              uVar12 = 0;
              puVar16 = d;
              puVar26 = puVar25;
              puVar25 = (uint *)fields;
              do {
                iVar23 = -1;
                if (0xa0 < (byte)(bVar17 + 0x81)) {
                  iVar23 = (int)""[bVar17 - 0x20];
                }
                puVar20 = (upb_MtDecoder *)(ulong)((uint)puVar20 | iVar23 << ((byte)uVar12 & 0x1f));
                if ((puVar26 == puVar6) || (bVar4 = (byte)*puVar26, (byte)(bVar4 + 0x9d) < 0xbd)) {
                  bVar27 = false;
                  puVar16 = puVar20;
                  puVar25 = puVar26;
                }
                else {
                  puVar26 = (uint *)((long)puVar26 + 1);
                  uVar12 = uVar12 + (uVar13 ^ 0xffffffe0) + 0x21;
                  bVar27 = uVar12 < 0x20;
                  bVar17 = bVar4;
                  if (!bVar27) {
                    puVar25 = (uint *)0x0;
                  }
                }
              } while (bVar27);
              if (puVar25 == (uint *)0x0) {
                pcVar18 = "Overlong varint";
                goto LAB_001246d6;
              }
              puVar7 = upb_MiniTable_FindFieldByNumber(d->table,(uint32_t)puVar16);
              if (puVar7 == (upb_MiniTableField *)0x0) {
                pcVar18 = "Couldn\'t add field number %u to oneof, no such field number.";
              }
              else {
                if (puVar7->offset_dont_copy_me__upb_internal_use_only == 1) {
                  bVar17 = puVar7->mode_dont_copy_me__upb_internal_use_only >> 6;
                  uVar13 = (uint)bVar17;
                  bVar27 = d->platform == kUpb_MiniTablePlatform_32Bit;
                  pbVar21 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + bVar17;
                  if (bVar27) {
                    pbVar21 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + bVar17;
                  }
                  uVar15 = CONCAT71((int7)((ulong)(&upb_MtDecoder_AlignOfRep_kRepToAlign64 + bVar17)
                                          >> 8),*pbVar21);
                  puVar2 = &upb_MtDecoder_SizeOfRep_kRepToSize64;
                  if (bVar27) {
                    puVar2 = &upb_MtDecoder_AlignOfRep_kRepToAlign64;
                  }
                  if (*pbVar21 <= (byte)puVar2[uVar19]) {
                    uVar13 = (uint)uVar19;
                  }
                  puVar7->offset_dont_copy_me__upb_internal_use_only = (uint16_t)uVar24;
                  uVar24 = (ulong)(((uint)((int)puVar7 - *(int *)&d->fields) >> 2) * -0x5555 + 3);
                  uVar19 = (ulong)uVar13;
                  goto LAB_001243cf;
                }
                pcVar18 = "Cannot add repeated, required, or singular field %u to oneof.";
              }
              uVar15 = (ulong)puVar16 & 0xffffffff;
              goto LAB_001246ea;
            }
            item._0_8_ = uVar24 & 0xffff | uVar19 << 0x20;
            item.type = (upb_LayoutItemType)uVar15;
            upb_MtDecoder_PushOneof(d,item);
            uVar24 = 0xffff;
            uVar15 = extraout_RDX;
          }
LAB_001243cf:
          puVar6 = (uint *)(d->base).end;
        } while (puVar25 < puVar6);
        uVar19 = uVar24 & 0xffff | uVar19 << 0x20;
        ptr = (char *)puVar25;
      }
      item_00.type = (upb_LayoutItemType)uVar15;
      item_00.field_index = (short)uVar19;
      item_00.offset = (short)(uVar19 >> 0x10);
      item_00.rep = (int)(uVar19 >> 0x20);
      upb_MtDecoder_PushOneof(d,item_00);
      bVar27 = true;
    }
    else {
      if (0x1f < (byte)(bVar17 + 0xa1)) {
        pcVar18 = "Invalid char: %c";
        goto LAB_001246ea;
      }
      if (bVar28) {
        d->table->dense_below_dont_copy_me__upb_internal_use_only =
             (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
        bVar28 = false;
      }
      ptr = (char *)0x1e;
      for (uVar13 = 0x1f; 0x1eU >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
      uVar11 = 0;
      uVar12 = 0;
      do {
        iVar23 = -1;
        if (0xa0 < (byte)((char)uVar19 + 0x81U)) {
          iVar23 = (int)""[((uint)uVar19 & 0xff) - 0x20];
        }
        uVar11 = uVar11 | iVar23 + -0x3c << ((byte)uVar12 & 0x1f);
        if ((puVar25 == puVar6) ||
           (uVar15 = (ulong)(byte)*puVar25, (byte)((byte)*puVar25 + 0x81) < 0xe0)) {
          bVar27 = false;
          ptr = (char *)puVar25;
          uVar15 = uVar19;
          unaff_R12D = uVar11;
        }
        else {
          puVar25 = (uint *)((long)puVar25 + 1);
          uVar12 = uVar12 + (uVar13 ^ 0xffffffe0) + 0x21;
          bVar27 = uVar12 < 0x20;
          if (!bVar27) {
            ptr = (char *)0x0;
          }
        }
        uVar19 = uVar15;
      } while (bVar27);
      if ((uint *)ptr == (uint *)0x0) goto LAB_00124668;
      uVar5 = (uVar5 + unaff_R12D) - 1;
      bVar27 = true;
    }
LAB_00124605:
    fields = puVar8;
    uVar13 = uVar14;
    if (!bVar27) {
      return (char *)local_60;
    }
  } while( true );
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}